

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dynamic_bit_vector.h
# Opt level: O0

void __thiscall
bsim::dynamic_bit_vector::dynamic_bit_vector(dynamic_bit_vector *this,dynamic_bit_vector *other)

{
  value_type vVar1;
  int iVar2;
  const_reference pvVar3;
  reference pvVar4;
  dynamic_bit_vector *in_RSI;
  vector<unsigned_char,_std::allocator<unsigned_char>_> *in_RDI;
  int i;
  vector<unsigned_char,_std::allocator<unsigned_char>_> *__new_size;
  undefined4 in_stack_ffffffffffffffe0;
  undefined4 in_stack_ffffffffffffffe4;
  
  __new_size = in_RDI;
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)0x21ae85);
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::size(&in_RSI->bits);
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
             CONCAT44(in_stack_ffffffffffffffe4,in_stack_ffffffffffffffe0),(size_type)__new_size);
  iVar2 = bitLength(in_RSI);
  *(int *)&in_RDI[1].super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
           super__Vector_impl_data._M_start = iVar2;
  for (iVar2 = 0;
      iVar2 < (int)((*(int *)&in_RDI[1].
                              super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                              _M_impl.super__Vector_impl_data._M_start / 8 + 1) -
                   (uint)(*(int *)&in_RDI[1].
                                   super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                   ._M_impl.super__Vector_impl_data._M_start % 8 == 0));
      iVar2 = iVar2 + 1) {
    pvVar3 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[]
                       (&in_RSI->bits,(long)iVar2);
    vVar1 = *pvVar3;
    pvVar4 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[]
                       (in_RDI,(long)iVar2);
    *pvVar4 = vVar1;
  }
  return;
}

Assistant:

dynamic_bit_vector(const dynamic_bit_vector& other) {
      bits.resize(other.bits.size());
      N = other.bitLength();
      for (int i = 0; i < NUM_BYTES(N); i++) {
	bits[i] = other.bits[i];
      }
    }